

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_execution_modes(spvc_compiler compiler,SpvExecutionMode **modes,size_t *num_modes)

{
  size_t count;
  SmallVector<SpvExecutionMode_,_8UL> *pSVar1;
  uint *puVar2;
  Bitset *pBVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  __node_base *p_Var6;
  long lVar7;
  _Head_base<0UL,_TemporaryBuffer<SpvExecutionMode_>_*,_false> local_a0;
  spvc_compiler local_98;
  anon_class_8_1_ba1d6e4e local_90;
  SmallVector<unsigned_int,_8UL> local_88;
  
  local_a0._M_head_impl = (TemporaryBuffer<SpvExecutionMode_> *)operator_new(0x40);
  pSVar1 = &(local_a0._M_head_impl)->buffer;
  (pSVar1->stack_storage).aligned_char[0x10] = '\0';
  (pSVar1->stack_storage).aligned_char[0x11] = '\0';
  (pSVar1->stack_storage).aligned_char[0x12] = '\0';
  (pSVar1->stack_storage).aligned_char[0x13] = '\0';
  (pSVar1->stack_storage).aligned_char[0x14] = '\0';
  (pSVar1->stack_storage).aligned_char[0x15] = '\0';
  (pSVar1->stack_storage).aligned_char[0x16] = '\0';
  (pSVar1->stack_storage).aligned_char[0x17] = '\0';
  pSVar1 = &(local_a0._M_head_impl)->buffer;
  (pSVar1->stack_storage).aligned_char[0x18] = '\0';
  (pSVar1->stack_storage).aligned_char[0x19] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1a] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1b] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1c] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1d] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1e] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1f] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[0] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[1] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[2] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[3] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[4] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[5] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[6] = '\0';
  ((local_a0._M_head_impl)->buffer).stack_storage.aligned_char[7] = '\0';
  pSVar1 = &(local_a0._M_head_impl)->buffer;
  (pSVar1->stack_storage).aligned_char[8] = '\0';
  (pSVar1->stack_storage).aligned_char[9] = '\0';
  (pSVar1->stack_storage).aligned_char[10] = '\0';
  (pSVar1->stack_storage).aligned_char[0xb] = '\0';
  (pSVar1->stack_storage).aligned_char[0xc] = '\0';
  (pSVar1->stack_storage).aligned_char[0xd] = '\0';
  (pSVar1->stack_storage).aligned_char[0xe] = '\0';
  (pSVar1->stack_storage).aligned_char[0xf] = '\0';
  ((local_a0._M_head_impl)->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation =
       (_func_int **)&PTR__TemporaryBuffer_0039db18;
  ((local_a0._M_head_impl)->buffer).super_VectorView<SpvExecutionMode_>.buffer_size = 0;
  ((local_a0._M_head_impl)->buffer).super_VectorView<SpvExecutionMode_>.ptr =
       (SpvExecutionMode_ *)&((local_a0._M_head_impl)->buffer).stack_storage;
  ((local_a0._M_head_impl)->buffer).buffer_capacity = 8;
  pBVar3 = spirv_cross::Compiler::get_execution_mode_bitset
                     ((compiler->compiler)._M_t.
                      super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                      .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  local_90.ptr = (unique_ptr<TemporaryBuffer<SpvExecutionMode_>,_std::default_delete<TemporaryBuffer<SpvExecutionMode_>_>_>
                  *)&local_a0;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if ((pBVar3->lower >> (uVar4 & 0x3f) & 1) != 0) {
      spvc_compiler_get_execution_modes::anon_class_8_1_ba1d6e4e::operator()
                (&local_90,(uint32_t)uVar4);
    }
  }
  count = (pBVar3->higher)._M_h._M_element_count;
  if (count != 0) {
    local_88.super_VectorView<unsigned_int>.ptr = (uint *)&local_88.stack_storage;
    local_88.super_VectorView<unsigned_int>.buffer_size = 0;
    local_88.buffer_capacity = 8;
    spirv_cross::SmallVector<unsigned_int,_8UL>::reserve(&local_88,count);
    p_Var6 = &(pBVar3->higher)._M_h._M_before_begin;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      spirv_cross::SmallVector<unsigned_int,_8UL>::push_back(&local_88,(uint *)(p_Var6 + 1));
    }
    local_98 = compiler;
    std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88.super_VectorView<unsigned_int>.ptr,
               (char *)local_88.super_VectorView<unsigned_int>.ptr +
               local_88.super_VectorView<unsigned_int>.buffer_size * 4);
    puVar2 = local_88.super_VectorView<unsigned_int>.ptr;
    lVar5 = local_88.super_VectorView<unsigned_int>.buffer_size << 2;
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 4) {
      spvc_compiler_get_execution_modes::anon_class_8_1_ba1d6e4e::operator()
                (&local_90,*(uint32_t *)((char *)puVar2 + lVar7));
    }
    spirv_cross::SmallVector<unsigned_int,_8UL>::~SmallVector(&local_88);
    compiler = local_98;
  }
  local_88.super_VectorView<unsigned_int>.ptr = (uint *)local_a0._M_head_impl;
  *modes = ((local_a0._M_head_impl)->buffer).super_VectorView<SpvExecutionMode_>.ptr;
  *num_modes = ((local_a0._M_head_impl)->buffer).super_VectorView<SpvExecutionMode_>.buffer_size;
  local_a0._M_head_impl = (TemporaryBuffer<SpvExecutionMode_> *)0x0;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&compiler->context->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &local_88);
  if ((TemporaryBuffer<SpvExecutionMode_> *)local_88.super_VectorView<unsigned_int>.ptr !=
      (TemporaryBuffer<SpvExecutionMode_> *)0x0) {
    (*((ScratchMemoryAllocation *)local_88.super_VectorView<unsigned_int>.ptr)->
      _vptr_ScratchMemoryAllocation[1])();
  }
  if (local_a0._M_head_impl != (TemporaryBuffer<SpvExecutionMode_> *)0x0) {
    (*((local_a0._M_head_impl)->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation[1])();
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_execution_modes(spvc_compiler compiler, const SpvExecutionMode **modes, size_t *num_modes)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto ptr = spvc_allocate<TemporaryBuffer<SpvExecutionMode>>();

		compiler->compiler->get_execution_mode_bitset().for_each_bit(
		    [&](uint32_t bit) { ptr->buffer.push_back(static_cast<SpvExecutionMode>(bit)); });

		*modes = ptr->buffer.data();
		*num_modes = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}